

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * __thiscall
Diligent::GetTexViewTypeLiteralName(Diligent::TEXTURE_VIEW_TYPE)::TexViewTypeToLiteralNameMap::
operator[](Diligent::TEXTURE_VIEW_TYPE__const(void *this,TEXTURE_VIEW_TYPE ViewType)

{
  const_reference ppcVar1;
  Char *Message;
  char local_48 [4];
  uint local_44;
  undefined1 local_40 [8];
  string msg;
  TEXTURE_VIEW_TYPE ViewType_local;
  TexViewTypeToLiteralNameMap *this_local;
  
  msg.field_2._M_local_buf[0xf] = ViewType;
  if (ViewType < TEXTURE_VIEW_NUM_VIEWS) {
    ppcVar1 = std::array<const_char_*,_7UL>::operator[]
                        ((array<const_char_*,_7UL> *)this,(ulong)ViewType);
    this_local = (TexViewTypeToLiteralNameMap *)*ppcVar1;
  }
  else {
    local_44 = (uint)ViewType;
    local_48[0] = '\x06';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    FormatString<char[20],unsigned_int,char[31],unsigned_int,char[2]>
              ((string *)local_40,(Diligent *)"Texture view type (",(char (*) [20])&local_44,
               (uint *)") is out of allowed range [0, ",(char (*) [31])local_48,(uint *)0x465aaf,
               (char (*) [2])local_40);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x2d7);
    std::__cxx11::string::~string((string *)local_40);
    this_local = (TexViewTypeToLiteralNameMap *)anon_var_dwarf_49f5ec;
  }
  return (Char *)this_local;
}

Assistant:

const Char* operator[](TEXTURE_VIEW_TYPE ViewType) const
        {
            if (ViewType >= TEXTURE_VIEW_UNDEFINED && ViewType < TEXTURE_VIEW_NUM_VIEWS)
            {
                return TexViewLiteralNames[ViewType];
            }
            else
            {
                UNEXPECTED("Texture view type (", static_cast<Uint32>(ViewType), ") is out of allowed range [0, ", static_cast<Uint32>(TEXTURE_VIEW_NUM_VIEWS) - 1, "]");
                return "<Unknown texture view type>";
            }
        }